

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_unittest.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::TestGenerator::Generate
          (TestGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  GeneratorContext *context_00;
  string filename;
  allocator<char> local_49;
  string local_48;
  TestGenerator local_28 [4];
  
  context_00 = context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_28,"Test.java",(allocator<char> *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"outer_class_scope",&local_49);
  TryInsert(local_28,&local_48,(string *)context,context_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"class_scope:foo.Bar",&local_49);
  TryInsert(local_28,&local_48,(string *)context,context_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"class_scope:foo.Bar.Baz",&local_49);
  TryInsert(local_28,&local_48,(string *)context,context_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"builder_scope:foo.Bar",&local_49);
  TryInsert(local_28,&local_48,(string *)context,context_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"builder_scope:foo.Bar.Baz",&local_49);
  TryInsert(local_28,&local_48,(string *)context,context_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"enum_scope:foo.Qux",&local_49);
  TryInsert(local_28,&local_48,(string *)context,context_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_28);
  return true;
}

Assistant:

bool Generate(const FileDescriptor* file, const std::string& parameter,
                GeneratorContext* context, std::string* error) const override {
    std::string filename = "Test.java";
    TryInsert(filename, "outer_class_scope", context);
    TryInsert(filename, "class_scope:foo.Bar", context);
    TryInsert(filename, "class_scope:foo.Bar.Baz", context);
    TryInsert(filename, "builder_scope:foo.Bar", context);
    TryInsert(filename, "builder_scope:foo.Bar.Baz", context);
    TryInsert(filename, "enum_scope:foo.Qux", context);
    return true;
  }